

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolver.hpp
# Opt level: O0

double __thiscall soplex::SPxSolverBase<double>::nonbasicValue(SPxSolverBase<double> *this)

{
  Representation RVar1;
  Type TVar2;
  Status SVar3;
  double *pdVar4;
  SPxSolverBase<double> *in_RDI;
  double dVar5;
  Desc *ds;
  StableSum<double> val;
  int i;
  double in_stack_fffffffffffffef8;
  int iVar6;
  SPxLPBase<double> *in_stack_ffffffffffffff00;
  StableSum<double> local_28;
  int local_14;
  double local_8;
  
  StableSum<double>::StableSum(&local_28);
  SPxBasisBase<double>::desc(&in_RDI->super_SPxBasisBase<double>);
  if ((in_RDI->m_nonbasicValueUpToDate & 1U) == 0) {
    RVar1 = rep(in_RDI);
    if (RVar1 == COLUMN) {
      TVar2 = type(in_RDI);
      if (TVar2 == LEAVE) {
        local_14 = SPxLPBase<double>::nCols((SPxLPBase<double> *)0x27bd93);
        while (local_14 = local_14 + -1, -1 < local_14) {
          SVar3 = SPxBasisBase<double>::Desc::colStatus
                            ((Desc *)in_stack_ffffffffffffff00,
                             (int)((ulong)in_stack_fffffffffffffef8 >> 0x20));
          iVar6 = (int)((ulong)in_stack_fffffffffffffef8 >> 0x20);
          if (SVar3 == P_FIXED) {
            pdVar4 = SPxLPBase<double>::maxObj(in_stack_ffffffffffffff00,iVar6);
            dVar5 = *pdVar4;
            pdVar4 = SPxLPBase<double>::lower
                               (in_stack_ffffffffffffff00,
                                (int)((ulong)in_stack_fffffffffffffef8 >> 0x20));
            StableSum<double>::operator+=(&local_28,dVar5 * *pdVar4);
          }
          else if (SVar3 == P_ON_LOWER) {
            pdVar4 = VectorBase<double>::operator[]
                               ((VectorBase<double> *)in_stack_ffffffffffffff00,iVar6);
            dVar5 = *pdVar4;
            pdVar4 = SPxLPBase<double>::lower
                               (in_stack_ffffffffffffff00,
                                (int)((ulong)in_stack_fffffffffffffef8 >> 0x20));
            StableSum<double>::operator+=(&local_28,dVar5 * *pdVar4);
          }
          else if (SVar3 == P_ON_UPPER) {
            pdVar4 = VectorBase<double>::operator[]
                               ((VectorBase<double> *)in_stack_ffffffffffffff00,iVar6);
            dVar5 = *pdVar4;
            pdVar4 = SPxLPBase<double>::upper
                               (in_stack_ffffffffffffff00,
                                (int)((ulong)in_stack_fffffffffffffef8 >> 0x20));
            StableSum<double>::operator+=(&local_28,dVar5 * *pdVar4);
          }
        }
        local_14 = SPxLPBase<double>::nRows((SPxLPBase<double> *)0x27bf1e);
        while (local_14 = local_14 + -1, -1 < local_14) {
          SVar3 = SPxBasisBase<double>::Desc::rowStatus
                            ((Desc *)in_stack_ffffffffffffff00,
                             (int)((ulong)in_stack_fffffffffffffef8 >> 0x20));
          iVar6 = (int)((ulong)in_stack_fffffffffffffef8 >> 0x20);
          if (SVar3 == P_FIXED) {
            pdVar4 = SPxLPBase<double>::maxRowObj(in_stack_ffffffffffffff00,iVar6);
            dVar5 = *pdVar4;
            pdVar4 = SPxLPBase<double>::lhs
                               (in_stack_ffffffffffffff00,
                                (int)((ulong)in_stack_fffffffffffffef8 >> 0x20));
            StableSum<double>::operator+=(&local_28,dVar5 * *pdVar4);
          }
          else if (SVar3 == P_ON_LOWER) {
            pdVar4 = VectorBase<double>::operator[]
                               ((VectorBase<double> *)in_stack_ffffffffffffff00,iVar6);
            dVar5 = *pdVar4;
            pdVar4 = SPxLPBase<double>::lhs
                               (in_stack_ffffffffffffff00,
                                (int)((ulong)in_stack_fffffffffffffef8 >> 0x20));
            StableSum<double>::operator+=(&local_28,dVar5 * *pdVar4);
          }
          else if (SVar3 == P_ON_UPPER) {
            pdVar4 = VectorBase<double>::operator[]
                               ((VectorBase<double> *)in_stack_ffffffffffffff00,iVar6);
            dVar5 = *pdVar4;
            pdVar4 = SPxLPBase<double>::rhs
                               (in_stack_ffffffffffffff00,
                                (int)((ulong)in_stack_fffffffffffffef8 >> 0x20));
            StableSum<double>::operator+=(&local_28,dVar5 * *pdVar4);
          }
        }
      }
      else {
        local_14 = SPxLPBase<double>::nCols((SPxLPBase<double> *)0x27c0ae);
        while (local_14 = local_14 + -1, -1 < local_14) {
          SVar3 = SPxBasisBase<double>::Desc::colStatus
                            ((Desc *)in_stack_ffffffffffffff00,
                             (int)((ulong)in_stack_fffffffffffffef8 >> 0x20));
          iVar6 = (int)((ulong)in_stack_fffffffffffffef8 >> 0x20);
          if (SVar3 == P_FIXED) {
            pdVar4 = SPxLPBase<double>::maxObj(in_stack_ffffffffffffff00,iVar6);
            dVar5 = *pdVar4;
            pdVar4 = VectorBase<double>::operator[]
                               ((VectorBase<double> *)in_stack_ffffffffffffff00,
                                (int)((ulong)in_stack_fffffffffffffef8 >> 0x20));
            StableSum<double>::operator+=(&local_28,dVar5 * *pdVar4);
          }
          else if (SVar3 == P_ON_LOWER) {
            pdVar4 = SPxLPBase<double>::maxObj(in_stack_ffffffffffffff00,iVar6);
            dVar5 = *pdVar4;
            pdVar4 = VectorBase<double>::operator[]
                               ((VectorBase<double> *)in_stack_ffffffffffffff00,
                                (int)((ulong)in_stack_fffffffffffffef8 >> 0x20));
            StableSum<double>::operator+=(&local_28,dVar5 * *pdVar4);
          }
          else if (SVar3 == P_ON_UPPER) {
            pdVar4 = SPxLPBase<double>::maxObj(in_stack_ffffffffffffff00,iVar6);
            dVar5 = *pdVar4;
            pdVar4 = VectorBase<double>::operator[]
                               ((VectorBase<double> *)in_stack_ffffffffffffff00,
                                (int)((ulong)in_stack_fffffffffffffef8 >> 0x20));
            StableSum<double>::operator+=(&local_28,dVar5 * *pdVar4);
          }
        }
        local_14 = SPxLPBase<double>::nRows((SPxLPBase<double> *)0x27c234);
        while (local_14 = local_14 + -1, -1 < local_14) {
          SVar3 = SPxBasisBase<double>::Desc::rowStatus
                            ((Desc *)in_stack_ffffffffffffff00,
                             (int)((ulong)in_stack_fffffffffffffef8 >> 0x20));
          iVar6 = (int)((ulong)in_stack_fffffffffffffef8 >> 0x20);
          if (SVar3 == P_FIXED) {
            pdVar4 = SPxLPBase<double>::maxRowObj(in_stack_ffffffffffffff00,iVar6);
            dVar5 = *pdVar4;
            pdVar4 = VectorBase<double>::operator[]
                               ((VectorBase<double> *)in_stack_ffffffffffffff00,
                                (int)((ulong)in_stack_fffffffffffffef8 >> 0x20));
            StableSum<double>::operator+=(&local_28,dVar5 * *pdVar4);
          }
          else if (SVar3 == P_ON_LOWER) {
            pdVar4 = SPxLPBase<double>::maxRowObj(in_stack_ffffffffffffff00,iVar6);
            dVar5 = *pdVar4;
            pdVar4 = VectorBase<double>::operator[]
                               ((VectorBase<double> *)in_stack_ffffffffffffff00,
                                (int)((ulong)in_stack_fffffffffffffef8 >> 0x20));
            StableSum<double>::operator+=(&local_28,dVar5 * *pdVar4);
          }
          else if (SVar3 == P_ON_UPPER) {
            pdVar4 = SPxLPBase<double>::maxRowObj(in_stack_ffffffffffffff00,iVar6);
            dVar5 = *pdVar4;
            pdVar4 = VectorBase<double>::operator[]
                               ((VectorBase<double> *)in_stack_ffffffffffffff00,
                                (int)((ulong)in_stack_fffffffffffffef8 >> 0x20));
            StableSum<double>::operator+=(&local_28,dVar5 * *pdVar4);
          }
        }
      }
    }
    else {
      local_14 = SPxLPBase<double>::nCols((SPxLPBase<double> *)0x27c3b2);
      while (local_14 = local_14 + -1, -1 < local_14) {
        SVar3 = SPxBasisBase<double>::Desc::colStatus
                          ((Desc *)in_stack_ffffffffffffff00,
                           (int)((ulong)in_stack_fffffffffffffef8 >> 0x20));
        iVar6 = (int)((ulong)in_stack_fffffffffffffef8 >> 0x20);
        if (SVar3 == D_ON_UPPER) {
          pdVar4 = VectorBase<double>::operator[]
                             ((VectorBase<double> *)in_stack_ffffffffffffff00,iVar6);
          dVar5 = *pdVar4;
          pdVar4 = SPxLPBase<double>::lower
                             (in_stack_ffffffffffffff00,
                              (int)((ulong)in_stack_fffffffffffffef8 >> 0x20));
          StableSum<double>::operator+=(&local_28,dVar5 * *pdVar4);
        }
        else if (SVar3 == D_ON_LOWER) {
          pdVar4 = VectorBase<double>::operator[]
                             ((VectorBase<double> *)in_stack_ffffffffffffff00,iVar6);
          dVar5 = *pdVar4;
          pdVar4 = SPxLPBase<double>::upper
                             (in_stack_ffffffffffffff00,
                              (int)((ulong)in_stack_fffffffffffffef8 >> 0x20));
          StableSum<double>::operator+=(&local_28,dVar5 * *pdVar4);
        }
        else if (SVar3 == D_ON_BOTH) {
          pdVar4 = VectorBase<double>::operator[]
                             ((VectorBase<double> *)in_stack_ffffffffffffff00,iVar6);
          dVar5 = *pdVar4;
          pdVar4 = SPxLPBase<double>::upper
                             (in_stack_ffffffffffffff00,
                              (int)((ulong)in_stack_fffffffffffffef8 >> 0x20));
          StableSum<double>::operator+=(&local_28,dVar5 * *pdVar4);
          pdVar4 = VectorBase<double>::operator[]
                             ((VectorBase<double> *)in_stack_ffffffffffffff00,
                              (int)((ulong)in_stack_fffffffffffffef8 >> 0x20));
          dVar5 = *pdVar4;
          pdVar4 = SPxLPBase<double>::lower
                             (in_stack_ffffffffffffff00,
                              (int)((ulong)in_stack_fffffffffffffef8 >> 0x20));
          StableSum<double>::operator+=(&local_28,dVar5 * *pdVar4);
        }
      }
      local_14 = SPxLPBase<double>::nRows((SPxLPBase<double> *)0x27c57b);
      while (local_14 = local_14 + -1, -1 < local_14) {
        SVar3 = SPxBasisBase<double>::Desc::rowStatus
                          ((Desc *)in_stack_ffffffffffffff00,
                           (int)((ulong)in_stack_fffffffffffffef8 >> 0x20));
        iVar6 = (int)((ulong)in_stack_fffffffffffffef8 >> 0x20);
        if (SVar3 == D_ON_UPPER) {
          pdVar4 = VectorBase<double>::operator[]
                             ((VectorBase<double> *)in_stack_ffffffffffffff00,iVar6);
          dVar5 = *pdVar4;
          pdVar4 = SPxLPBase<double>::lhs
                             (in_stack_ffffffffffffff00,
                              (int)((ulong)in_stack_fffffffffffffef8 >> 0x20));
          StableSum<double>::operator+=(&local_28,dVar5 * *pdVar4);
        }
        else if (SVar3 == D_ON_LOWER) {
          pdVar4 = VectorBase<double>::operator[]
                             ((VectorBase<double> *)in_stack_ffffffffffffff00,iVar6);
          dVar5 = *pdVar4;
          pdVar4 = SPxLPBase<double>::rhs
                             (in_stack_ffffffffffffff00,
                              (int)((ulong)in_stack_fffffffffffffef8 >> 0x20));
          StableSum<double>::operator+=(&local_28,dVar5 * *pdVar4);
        }
        else if (SVar3 == D_ON_BOTH) {
          pdVar4 = VectorBase<double>::operator[]
                             ((VectorBase<double> *)in_stack_ffffffffffffff00,iVar6);
          in_stack_fffffffffffffef8 = *pdVar4;
          pdVar4 = SPxLPBase<double>::rhs
                             (in_stack_ffffffffffffff00,
                              (int)((ulong)in_stack_fffffffffffffef8 >> 0x20));
          StableSum<double>::operator+=(&local_28,in_stack_fffffffffffffef8 * *pdVar4);
          pdVar4 = VectorBase<double>::operator[]
                             ((VectorBase<double> *)in_stack_ffffffffffffff00,
                              (int)((ulong)in_stack_fffffffffffffef8 >> 0x20));
          in_stack_ffffffffffffff00 = (SPxLPBase<double> *)*pdVar4;
          pdVar4 = SPxLPBase<double>::lhs
                             (in_stack_ffffffffffffff00,
                              (int)((ulong)in_stack_fffffffffffffef8 >> 0x20));
          StableSum<double>::operator+=(&local_28,(double)in_stack_ffffffffffffff00 * *pdVar4);
        }
      }
    }
    if ((in_RDI->m_nonbasicValueUpToDate & 1U) == 0) {
      dVar5 = StableSum::operator_cast_to_double((StableSum *)&local_28);
      in_RDI->m_nonbasicValue = dVar5;
      in_RDI->m_nonbasicValueUpToDate = true;
    }
    local_8 = StableSum::operator_cast_to_double((StableSum *)&local_28);
  }
  else {
    local_8 = in_RDI->m_nonbasicValue;
  }
  return local_8;
}

Assistant:

R SPxSolverBase<R>::nonbasicValue()
   {
      int i;
      StableSum<R> val;
      const typename SPxBasisBase<R>::Desc& ds = this->desc();

#ifndef ENABLE_ADDITIONAL_CHECKS

      // if the value is available we don't need to recompute it
      if(m_nonbasicValueUpToDate)
         return m_nonbasicValue;

#endif

      if(rep() == COLUMN)
      {
         if(type() == LEAVE)
         {
            for(i = this->nCols() - 1; i >= 0; --i)
            {
               switch(ds.colStatus(i))
               {
               case SPxBasisBase<R>::Desc::P_ON_UPPER :
                  val += theUCbound[i] * SPxLPBase<R>::upper(i);
                  //@ val += maxObj(i) * SPxLPBase<R>::upper(i);
                  break;

               case SPxBasisBase<R>::Desc::P_ON_LOWER :
                  val += theLCbound[i] * SPxLPBase<R>::lower(i);
                  //@ val += maxObj(i) * SPxLPBase<R>::lower(i);
                  break;

               case SPxBasisBase<R>::Desc::P_FIXED :
                  assert(EQ(SPxLPBase<R>::lower(i), SPxLPBase<R>::upper(i), this->epsilon()));
                  val += this->maxObj(i) * SPxLPBase<R>::lower(i);
                  break;

               default:
                  break;
               }
            }

            for(i = this->nRows() - 1; i >= 0; --i)
            {
               switch(ds.rowStatus(i))
               {
               case SPxBasisBase<R>::Desc::P_ON_UPPER :
                  val += theLRbound[i] * SPxLPBase<R>::rhs(i);
                  break;

               case SPxBasisBase<R>::Desc::P_ON_LOWER :
                  val += theURbound[i] * SPxLPBase<R>::lhs(i);
                  break;

               case SPxBasisBase<R>::Desc::P_FIXED :
                  assert(EQ(SPxLPBase<R>::lhs(i), SPxLPBase<R>::rhs(i), this->epsilon()));
                  val += this->maxRowObj(i) * SPxLPBase<R>::lhs(i);
                  break;

               default:
                  break;
               }
            }
         }
         else
         {
            assert(type() == ENTER);

            for(i = this->nCols() - 1; i >= 0; --i)
            {
               switch(ds.colStatus(i))
               {
               case SPxBasisBase<R>::Desc::P_ON_UPPER :
                  val += this->maxObj(i) * theUCbound[i];
                  break;

               case SPxBasisBase<R>::Desc::P_ON_LOWER :
                  val += this->maxObj(i) * theLCbound[i];
                  break;

               case SPxBasisBase<R>::Desc::P_FIXED :
                  assert(EQ(theLCbound[i], theUCbound[i], this->epsilon()));
                  val += this->maxObj(i) * theLCbound[i];
                  break;

               default:
                  break;
               }
            }

            for(i = this->nRows() - 1; i >= 0; --i)
            {
               switch(ds.rowStatus(i))
               {
               case SPxBasisBase<R>::Desc::P_ON_UPPER :
                  val += this->maxRowObj(i) * theLRbound[i];
                  break;

               case SPxBasisBase<R>::Desc::P_ON_LOWER :
                  val += this->maxRowObj(i) * theURbound[i];
                  break;

               case SPxBasisBase<R>::Desc::P_FIXED :
                  assert(EQ(theLRbound[i], theURbound[i], this->epsilon()));
                  val += this->maxRowObj(i) * theURbound[i];
                  break;

               default:
                  break;
               }
            }
         }
      }
      else
      {
         assert(rep() == ROW);
         assert(type() == ENTER);

         for(i = this->nCols() - 1; i >= 0; --i)
         {
            switch(ds.colStatus(i))
            {
            case SPxBasisBase<R>::Desc::D_ON_UPPER :
               val += theUCbound[i] * this->lower(i);
               break;

            case SPxBasisBase<R>::Desc::D_ON_LOWER :
               val += theLCbound[i] * this->upper(i);
               break;

            case SPxBasisBase<R>::Desc::D_ON_BOTH :
               val += theLCbound[i] * this->upper(i);
               val += theUCbound[i] * this->lower(i);
               break;

            default:
               break;
            }
         }

         for(i = this->nRows() - 1; i >= 0; --i)
         {
            switch(ds.rowStatus(i))
            {
            case SPxBasisBase<R>::Desc::D_ON_UPPER :
               val += theURbound[i] * this->lhs(i);
               break;

            case SPxBasisBase<R>::Desc::D_ON_LOWER :
               val += theLRbound[i] * this->rhs(i);
               break;

            case SPxBasisBase<R>::Desc::D_ON_BOTH :
               val += theLRbound[i] * this->rhs(i);
               val += theURbound[i] * this->lhs(i);
               break;

            default:
               break;
            }
         }
      }

#ifdef ENABLE_ADDITIONAL_CHECKS

      if(m_nonbasicValueUpToDate && NE(m_nonbasicValue, val))
      {
         SPX_MSG_ERROR(std::cerr << "stored nonbasic value: " << m_nonbasicValue
                       << ", correct nonbasic value: " << val
                       << ", violation: " << val - m_nonbasicValue << std::endl;)
         assert(EQrel(m_nonbasicValue, val, 1e-12));
      }

#endif

      if(!m_nonbasicValueUpToDate)
      {
         m_nonbasicValue = R(val);
         m_nonbasicValueUpToDate = true;
      }

      return val;
   }